

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O2

void __thiscall
ExprTest_EqualNumericConstant_Test::TestBody(ExprTest_EqualNumericConstant_Test *this)

{
  bool bVar1;
  NumericConstant NVar2;
  NumericConstant NVar3;
  char *in_R9;
  ExprFactory *this_00;
  AssertHelper local_50;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  string local_40;
  AssertionResult gtest_ar_;
  
  this_00 = &(this->super_ExprTest).factory_;
  NVar2 = mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(this_00,0.42);
  NVar3 = mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(this_00,0.42);
  gtest_ar_.success_ =
       mp::Equal((Expr)NVar2.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.
                       impl_,
                 (Expr)NVar3.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.
                       impl_);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)&gtest_ar_,
               (AssertionResult *)"Equal(MakeConst(0.42), MakeConst(0.42))","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x2ca
               ,local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  NVar2 = mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(this_00,0.42);
  NVar3 = mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(this_00,42.0);
  bVar1 = mp::Equal((Expr)NVar2.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase
                          .impl_,
                    (Expr)NVar3.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase
                          .impl_);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)&gtest_ar_,
               (AssertionResult *)"Equal(MakeConst(0.42), MakeConst(42))","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x2cb
               ,local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(ExprTest, EqualNumericConstant) {
  EXPECT_TRUE(Equal(MakeConst(0.42), MakeConst(0.42)));
  EXPECT_FALSE(Equal(MakeConst(0.42), MakeConst(42)));
}